

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86NEG(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  
  if (1 < size - sDWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x416,"int x86NEG(unsigned char *, x86Size, x86Reg, int, x86Reg, int)");
  }
  bVar2 = 8 < (int)base | (8 < (int)index) * '\x02' | (size == sQWORD) << 3;
  if (bVar2 != 0) {
    *stream = bVar2 | 0x40;
  }
  puVar1 = stream + (bVar2 != 0);
  *puVar1 = 0xf7;
  uVar3 = encodeAddress(puVar1 + 1,index,multiplier,base,shift,3);
  return (uVar3 + (int)(puVar1 + 1)) - (int)stream;
}

Assistant:

int x86NEG(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, rNONE, index, base);
	*stream++ = 0xf7;
	stream += encodeAddress(stream, index, multiplier, base, shift, 3);

	return int(stream - start);
}